

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall
QXmlStreamWriterPrivate::writeNamespaceDeclaration
          (QXmlStreamWriterPrivate *this,NamespaceDeclaration *namespaceDeclaration)

{
  bool bVar1;
  char *len;
  char *str;
  size_t in_RCX;
  int *piVar2;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 *__n;
  XmlStringRef *in_RSI;
  QXmlStreamWriterPrivate *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_fffffffffffffe40;
  QChar *in_stack_fffffffffffffe48;
  QAnyStringView *in_stack_fffffffffffffe50;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 *this_00;
  int local_88;
  void *local_80;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_78;
  void *local_70;
  int local_68;
  void *local_60;
  int local_58 [2];
  void *local_50;
  int local_48;
  void *local_40;
  int local_38;
  void *local_30;
  int local_28 [2];
  void *local_20;
  int local_18;
  void *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QtPrivate::XmlStringRef::isEmpty(in_RSI);
  if (bVar1) {
    std::data<char_const,9ul>((char (*) [9])" xmlns=\"");
    QtPrivate::lengthHelperContainer<char,9ul>((char (*) [9])0x64c563);
    QAnyStringView::QAnyStringView<char,_true>
              (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40
              );
    write(in_RDI,local_18,local_10,in_RCX);
    piVar2 = local_28;
    std::data<QtPrivate::XmlStringRef>((XmlStringRef *)0x64c5f4);
    QtPrivate::lengthHelperContainer<QtPrivate::XmlStringRef>((XmlStringRef *)0x64c609);
    QAnyStringView::QAnyStringView<QChar,_true>
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    write(in_RDI,local_28[0],local_20,(size_t)piVar2);
    std::data<char_const,2ul>((char (*) [2])0x92e5dd);
    QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x64c697);
    QAnyStringView::QAnyStringView<char,_true>
              (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40
              );
    write(in_RDI,local_38,local_30,(size_t)piVar2);
  }
  else {
    std::data<char_const,8ul>((char (*) [8])" xmlns:");
    QtPrivate::lengthHelperContainer<char,8ul>((char (*) [8])0x64c72b);
    QAnyStringView::QAnyStringView<char,_true>
              (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40
              );
    write(in_RDI,local_48,local_40,in_RCX);
    piVar2 = local_58;
    std::data<QtPrivate::XmlStringRef>((XmlStringRef *)0x64c7a9);
    QtPrivate::lengthHelperContainer<QtPrivate::XmlStringRef>((XmlStringRef *)0x64c7bb);
    QAnyStringView::QAnyStringView<QChar,_true>
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    write(in_RDI,local_58[0],local_50,(size_t)piVar2);
    std::data<char_const,3ul>((char (*) [3])0x93071d);
    QtPrivate::lengthHelperContainer<char,3ul>((char (*) [3])0x64c843);
    QAnyStringView::QAnyStringView<char,_true>
              (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40
              );
    write(in_RDI,local_68,local_60,(size_t)piVar2);
    __n = &local_78;
    this_00 = __n;
    std::data<QtPrivate::XmlStringRef>((XmlStringRef *)0x64c8c5);
    QtPrivate::lengthHelperContainer<QtPrivate::XmlStringRef>((XmlStringRef *)0x64c8d7);
    QAnyStringView::QAnyStringView<QChar,_true>
              ((QAnyStringView *)this_00,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    write(in_RDI,local_78._0_4_,local_70,(size_t)__n);
    len = std::data<char_const,2ul>((char (*) [2])0x92e5dd);
    str = (char *)QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x64c95e);
    QAnyStringView::QAnyStringView<char,_true>((QAnyStringView *)this_00,str,(qsizetype)len);
    write(in_RDI,local_88,local_80,(size_t)__n);
  }
  in_RDI->field_0x79 = in_RDI->field_0x79 | 2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamWriterPrivate::writeNamespaceDeclaration(const NamespaceDeclaration &namespaceDeclaration) {
    if (namespaceDeclaration.prefix.isEmpty()) {
        write(" xmlns=\"");
        write(namespaceDeclaration.namespaceUri);
        write("\"");
    } else {
        write(" xmlns:");
        write(namespaceDeclaration.prefix);
        write("=\"");
        write(namespaceDeclaration.namespaceUri);
        write("\"");
    }
    didWriteAnyToken = true;
}